

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O1

uint32 __thiscall Clasp::Asp::RuleTransform::Impl::transformChoice(Impl *this,AtomSpan *atoms)

{
  size_type *psVar1;
  uint *puVar2;
  Atom_t AVar3;
  uint32 uVar4;
  uint32 uVar5;
  uint32 uVar6;
  long lVar7;
  Lit_t bLit;
  LitSpan bAux;
  AtomSpan local_80;
  int local_70;
  uint local_6c;
  LitVec *local_68;
  uint *local_60;
  long local_58;
  LitSpan local_50;
  LitSpan local_40;
  
  local_40.first = &local_70;
  local_70 = 0;
  local_40.size = 1;
  if (atoms->size == 0) {
    uVar6 = 0;
  }
  else {
    local_60 = atoms->first;
    local_68 = &this->lits_;
    local_58 = atoms->size << 2;
    lVar7 = 0;
    uVar6 = 0;
    do {
      if (this->prg_ == (LogicProgram *)0x0) {
        AVar3 = (**this->adapt_->_vptr_ProgramAdapter)();
      }
      else {
        AVar3 = LogicProgram::newAtom(this->prg_);
      }
      puVar2 = local_60;
      local_70 = -*(int *)((long)local_60 + lVar7);
      local_80.first = (uint *)CONCAT44(local_80.first._4_4_,-AVar3);
      bk_lib::pod_vector<int,_std::allocator<int>_>::push_back(local_68,(int *)&local_80);
      local_6c = *(uint *)((long)puVar2 + lVar7);
      local_50.size = (size_t)(this->lits_).ebo_.size;
      local_50.first = (int *)local_50.size;
      if ((pointer)local_50.size != (pointer)0x0) {
        local_50.first = (this->lits_).ebo_.buf;
      }
      local_80.size = (size_t)(local_6c != 0);
      local_80.first = &local_6c;
      uVar4 = addRule(this,(Head_t)0x0,&local_80,&local_50);
      local_50.first = (int *)CONCAT44(local_50.first._4_4_,AVar3);
      local_80.size = (size_t)(AVar3 != 0);
      local_80.first = (uint *)&local_50;
      uVar5 = addRule(this,(Head_t)0x0,&local_80,&local_40);
      psVar1 = &(this->lits_).ebo_.size;
      *psVar1 = *psVar1 - 1;
      uVar6 = uVar5 + uVar6 + uVar4;
      lVar7 = lVar7 + 4;
    } while (local_58 != lVar7);
  }
  return uVar6;
}

Assistant:

uint32 RuleTransform::Impl::transformChoice(const Potassco::AtomSpan& atoms) {
	uint32 nRule = 0;
	Potassco::Lit_t   bLit = 0;
	Potassco::LitSpan bAux = Potassco::toSpan(&bLit, 1);
	Atom_t hAux;
	for (Potassco::AtomSpan::iterator it = Potassco::begin(atoms), end = Potassco::end(atoms); it != end; ++it) {
		hAux = newAtom();
		bLit = Potassco::neg(*it);
		lits_.push_back(Potassco::neg(hAux));
		nRule += addRule(*it, Potassco::toSpan(lits_));
		nRule += addRule(hAux, bAux);
		lits_.pop_back();
	}
	return nRule;
}